

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::emplaceRealloc<>
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this,pointer pos)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pSVar4;
  long lVar5;
  pointer pSVar6;
  iterator pSVar7;
  EVP_PKEY_CTX *ctx;
  iterator in_RSI;
  SmallVectorBase<slang::SmallVector<int,_10UL>_> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  SmallVector<int,_10UL> *in_stack_ffffffffffffffa0;
  SmallVector<int,_10UL> *in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb0;
  iterator __first;
  SmallVectorBase<slang::SmallVector<int,_10UL>_> *in_stack_ffffffffffffffb8;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::SmallVector<int,_10UL>_> *)0x929ff6);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  __first = in_RSI;
  pSVar4 = begin(in_RDI);
  lVar5 = (long)__first - (long)pSVar4;
  pSVar6 = (pointer)operator_new(0x92a055);
  SmallVector<int,_10UL>::SmallVector((SmallVector<int,_10UL> *)0x92a07a);
  pSVar4 = in_RSI;
  pSVar7 = end(in_RDI);
  if (pSVar4 == pSVar7) {
    pSVar4 = begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::SmallVector<int,10ul>*,slang::SmallVector<int,10ul>*>
              (__first,pSVar4,in_stack_ffffffffffffffa0);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::SmallVector<int,10ul>*,slang::SmallVector<int,10ul>*>
              (__first,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<slang::SmallVector<int,10ul>*,slang::SmallVector<int,10ul>*>
              (__first,in_stack_ffffffffffffffa8,in_RSI);
  }
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pSVar6;
  return pSVar6 + (lVar5 >> 6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}